

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O1

bool __thiscall
Amiga::Audio::Channel::output<(Amiga::Audio::Channel::State)3>(Channel *this,Channel *moduland)

{
  uint16_t *puVar1;
  bool bVar2;
  
  if (this->period_counter != 1) {
    this->period_counter = this->period_counter - 1;
    return false;
  }
  this->state = PlayingLow;
  this->output_level = (int8_t)this->data_latch;
  if (this->attach_period == true) {
    this->data_latch = this->data;
    if (moduland != (Channel *)0x0) {
      moduland->period = this->data;
    }
    bVar2 = true;
    if (this->dma_enabled != true) goto LAB_0020f0d9;
    this->wants_data = true;
    if (this->will_request_interrupt == true) {
      this->will_request_interrupt = false;
      goto LAB_0020f0d9;
    }
  }
  bVar2 = false;
LAB_0020f0d9:
  this->period_counter = this->period;
  if ((this->dma_enabled == true) && (this->wants_data == false)) {
    puVar1 = &this->length_counter;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      this->length_counter = this->length;
      this->will_request_interrupt = true;
      this->should_reload_address = true;
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool Audio::Channel::output<Audio::Channel::State::PlayingHigh>(Channel *moduland) {
	// This is a reasonable guess as to the exit condition for this node;
	// Commodore doesn't document.
	if(period_counter == 1) {
		return transit<State::PlayingHigh, State::PlayingLow>(moduland);
	}

	// percount.
	-- period_counter;

	return false;
}